

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O1

void __thiscall
efsw::FileWatcherInotify::removeWatchLocked(FileWatcherInotify *this,WatchID watchid)

{
  _Rb_tree_header *p_Var1;
  WatcherInotify *parent;
  pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar2;
  bool bVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr *__args;
  _Base_ptr p_Var6;
  iterator iVar7;
  iterator __position;
  long *plVar8;
  vector<long,_std::allocator<long>_> eraseWatches;
  long *local_48;
  iterator iStack_40;
  long *local_38;
  
  p_Var1 = &(this->mWatches)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(long *)(p_Var6 + 1) < watchid]) {
    if (watchid <= *(long *)(p_Var6 + 1)) {
      p_Var4 = p_Var6;
    }
  }
  iVar7._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (iVar7._M_node = p_Var4, watchid < *(long *)(p_Var4 + 1))) {
    iVar7._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)iVar7._M_node != p_Var1) {
    parent = (WatcherInotify *)iVar7._M_node[1]._M_parent;
    __position._M_current =
         (this->mMovedOutsideWatches).
         super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    ppVar2 = (this->mMovedOutsideWatches).
             super__Vector_base<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (ppVar2 != __position._M_current) {
      do {
        if ((__position._M_current)->first == parent) {
          std::
          vector<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<efsw::WatcherInotify_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase(&this->mMovedOutsideWatches,__position);
          break;
        }
        __position._M_current = __position._M_current + 1;
      } while (__position._M_current != ppVar2);
    }
    if (((parent->super_Watcher).Recursive == true) && (parent->Parent == (WatcherInotify *)0x0)) {
      p_Var5 = (this->mWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_48 = (long *)0x0;
      iStack_40._M_current = (long *)0x0;
      local_38 = (long *)0x0;
      plVar8 = local_48;
      while (local_48 = plVar8, (_Rb_tree_header *)p_Var5 != p_Var1) {
        if (((WatcherInotify *)p_Var5[1]._M_parent != parent) &&
           (bVar3 = WatcherInotify::inParentTree((WatcherInotify *)p_Var5[1]._M_parent,parent),
           bVar3)) {
          __args = &p_Var5[1]._M_parent[3]._M_parent;
          if (iStack_40._M_current == local_38) {
            std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                      ((vector<long,std::allocator<long>> *)&local_48,iStack_40,(long *)__args);
          }
          else {
            *iStack_40._M_current = (long)*__args;
            iStack_40._M_current = iStack_40._M_current + 1;
          }
        }
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        plVar8 = local_48;
      }
      for (; plVar8 != iStack_40._M_current; plVar8 = plVar8 + 1) {
        (*(this->super_FileWatcherImpl)._vptr_FileWatcherImpl[4])(this,*plVar8);
      }
      if (local_48 != (long *)0x0) {
        operator_delete(local_48);
      }
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase(&(this->mWatchesRef)._M_h,&(parent->super_Watcher).Directory);
    std::
    _Rb_tree<long,std::pair<long_const,efsw::WatcherInotify*>,std::_Select1st<std::pair<long_const,efsw::WatcherInotify*>>,std::less<long>,std::allocator<std::pair<long_const,efsw::WatcherInotify*>>>
    ::erase_abi_cxx11_((_Rb_tree<long,std::pair<long_const,efsw::WatcherInotify*>,std::_Select1st<std::pair<long_const,efsw::WatcherInotify*>>,std::less<long>,std::allocator<std::pair<long_const,efsw::WatcherInotify*>>>
                        *)&this->mWatches,iVar7);
    if (parent->Parent == (WatcherInotify *)0x0) {
      p_Var6 = (this->mRealWatches)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 = &(this->mRealWatches)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = &p_Var1->_M_header;
      if (p_Var6 != (_Base_ptr)0x0) {
        do {
          if (parent->InotifyID <= *(long *)(p_Var6 + 1)) {
            p_Var4 = p_Var6;
          }
          p_Var6 = (&p_Var6->_M_left)[*(long *)(p_Var6 + 1) < parent->InotifyID];
        } while (p_Var6 != (_Base_ptr)0x0);
      }
      iVar7._M_node = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
         (iVar7._M_node = p_Var4, parent->InotifyID < *(long *)(p_Var4 + 1))) {
        iVar7._M_node = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)iVar7._M_node != p_Var1) {
        std::
        _Rb_tree<long,std::pair<long_const,efsw::WatcherInotify*>,std::_Select1st<std::pair<long_const,efsw::WatcherInotify*>>,std::less<long>,std::allocator<std::pair<long_const,efsw::WatcherInotify*>>>
        ::erase_abi_cxx11_((_Rb_tree<long,std::pair<long_const,efsw::WatcherInotify*>,std::_Select1st<std::pair<long_const,efsw::WatcherInotify*>>,std::less<long>,std::allocator<std::pair<long_const,efsw::WatcherInotify*>>>
                            *)&this->mRealWatches,iVar7);
      }
    }
    inotify_rm_watch(this->mFD,(int)watchid);
    if (parent != (WatcherInotify *)0x0) {
      (*(parent->super_Watcher)._vptr_Watcher[1])(parent);
    }
  }
  return;
}

Assistant:

void FileWatcherInotify::removeWatchLocked( WatchID watchid ) {
	WatchMap::iterator iter = mWatches.find( watchid );
	if ( iter == mWatches.end() )
		return;

	WatcherInotify* watch = iter->second;

	for ( std::vector<std::pair<WatcherInotify*, std::string>>::iterator itm =
			  mMovedOutsideWatches.begin();
		  mMovedOutsideWatches.end() != itm; ++itm ) {
		if ( itm->first == watch ) {
			mMovedOutsideWatches.erase( itm );
			break;
		}
	}

	if ( watch->Recursive && NULL == watch->Parent ) {
		WatchMap::iterator it = mWatches.begin();
		std::vector<WatchID> eraseWatches;

		for ( ; it != mWatches.end(); ++it )
			if ( it->second != watch && it->second->inParentTree( watch ) )
				eraseWatches.push_back( it->second->InotifyID );

		for ( std::vector<WatchID>::iterator eit = eraseWatches.begin(); eit != eraseWatches.end();
			  ++eit ) {
			removeWatch( *eit );
		}
	}

	mWatchesRef.erase( watch->Directory );
	mWatches.erase( iter );

	if ( NULL == watch->Parent ) {
		WatchMap::iterator eraseit = mRealWatches.find( watch->InotifyID );

		if ( eraseit != mRealWatches.end() ) {
			mRealWatches.erase( eraseit );
		}
	}

	int err = inotify_rm_watch( mFD, watchid );

	if ( err < 0 ) {
		efDEBUG( "Error removing watch %d: %s\n", watchid, strerror( errno ) );
	} else {
		efDEBUG( "Removed watch %s with id: %d\n", watch->Directory.c_str(), watchid );
	}

	efSAFE_DELETE( watch );
}